

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeSerializer.cpp
# Opt level: O0

byte * __thiscall
Js::ByteCodeBufferReader::ReadReferencedPropertyIdMap
          (ByteCodeBufferReader *this,byte *current,FunctionBody *function)

{
  PropertyId propertyId_00;
  ByteCodeCache *this_00;
  PropertyId local_34;
  PropertyId propertyId;
  int value;
  uint i;
  uint count;
  FunctionBody *function_local;
  byte *current_local;
  ByteCodeBufferReader *this_local;
  
  _i = function;
  function_local = (FunctionBody *)current;
  current_local = (byte *)this;
  value = FunctionBody::GetReferencedPropertyIdCount(function);
  if (value == 0) {
    this_local = (ByteCodeBufferReader *)function_local;
  }
  else {
    FunctionBody::CreateReferencedPropertyIdMap(_i);
    for (propertyId = 0; (uint)propertyId < (uint)value; propertyId = propertyId + 1) {
      function_local = (FunctionBody *)ReadInt32(this,(byte *)function_local,&local_34);
      this_00 = FunctionBody::GetByteCodeCache(_i);
      propertyId_00 = ByteCodeCache::LookupNonBuiltinPropertyId(this_00,local_34);
      FunctionBody::SetReferencedPropertyIdWithMapIndex(_i,propertyId,propertyId_00);
    }
    FunctionBody::VerifyReferencedPropertyIdMap(_i);
    this_local = (ByteCodeBufferReader *)function_local;
  }
  return (byte *)this_local;
}

Assistant:

const byte * ReadReferencedPropertyIdMap(const byte * current, FunctionBody * function)
    {
        uint count = function->GetReferencedPropertyIdCount();
        if (count == 0)
        {
            return current;
        }

#ifdef BYTE_CODE_MAGIC_CONSTANTS
        int constant;
        current = ReadInt32(current, &constant);
        Assert(constant == magicStartOfReferencedPropIdMap);
#endif

        function->CreateReferencedPropertyIdMap();

        for (uint i = 0; i < count; i++)
        {
            int value;
            current = ReadInt32(current, &value);
            PropertyId propertyId = function->GetByteCodeCache()->LookupNonBuiltinPropertyId(value);
            function->SetReferencedPropertyIdWithMapIndex(i, propertyId);
        }

#ifdef BYTE_CODE_MAGIC_CONSTANTS
        current = ReadInt32(current, &constant);
        Assert(constant == magicEndOfReferencedPropIdMap);
#endif
#if DBG
        function->VerifyReferencedPropertyIdMap();
#endif
        return current;
    }